

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVectorPruning.cpp
# Opt level: O1

ValueFunctionPOMDPDiscrete *
AlphaVectorPruning::ParetoPrune
          (ValueFunctionPOMDPDiscrete *__return_storage_ptr__,ValueFunctionPOMDPDiscrete *Vin)

{
  vector<double,_std::allocator<double>_> *pvVar1;
  long lVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  ValueFunctionPOMDPDiscrete uset;
  AlphaVector v;
  AlphaVector u;
  vector<AlphaVector,_std::allocator<AlphaVector>_> local_188;
  ValueFunctionPOMDPDiscrete *local_170;
  AlphaVector local_168;
  AlphaVector local_138;
  vector<AlphaVector,_std::allocator<AlphaVector>_> local_108;
  AlphaVector local_e8;
  AlphaVector local_b8;
  AlphaVector local_88;
  AlphaVector local_58;
  
  std::vector<AlphaVector,_std::allocator<AlphaVector>_>::vector(&local_188,Vin);
  (__return_storage_ptr__->super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_170 = __return_storage_ptr__;
  if (local_188.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_188.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
      super__Vector_impl_data._M_start) {
    do {
      local_138._m_action =
           (local_188.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
            super__Vector_impl_data._M_start)->_m_action;
      local_138._4_4_ =
           *(undefined4 *)
            &(local_188.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
              super__Vector_impl_data._M_start)->field_0x4;
      local_138._m_betaI =
           (local_188.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
            super__Vector_impl_data._M_start)->_m_betaI;
      std::vector<double,_std::allocator<double>_>::vector
                (&local_138._m_values,
                 &(local_188.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
                   super__Vector_impl_data._M_start)->_m_values);
      if (1 < (ulong)(((long)local_188.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_188.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333))
      {
        uVar4 = 1;
        uVar5 = 2;
        do {
          pvVar1 = &local_188.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar4]._m_values;
          local_168._0_8_ = *(undefined8 *)((long)(pvVar1 + -1) + 8);
          local_168._m_betaI = *(BGPolicyIndex *)((long)(pvVar1 + -1) + 0x10);
          std::vector<double,_std::allocator<double>_>::vector(&local_168._m_values,pvVar1);
          local_58._m_action = local_168._m_action;
          local_58._4_4_ = local_168._4_4_;
          local_58._m_betaI = local_168._m_betaI;
          std::vector<double,_std::allocator<double>_>::vector
                    (&local_58._m_values,&local_168._m_values);
          local_88._m_action = local_138._m_action;
          local_88._4_4_ = local_138._4_4_;
          local_88._m_betaI = local_138._m_betaI;
          std::vector<double,_std::allocator<double>_>::vector
                    (&local_88._m_values,&local_138._m_values);
          bVar3 = ParetoDominates(&local_58,&local_88);
          AlphaVector::~AlphaVector(&local_88);
          AlphaVector::~AlphaVector(&local_58);
          if (bVar3) {
            AlphaVector::operator=(&local_138,&local_168);
          }
          AlphaVector::~AlphaVector(&local_168);
          uVar4 = ((long)local_188.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_188.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
          bVar3 = uVar5 <= uVar4;
          lVar2 = uVar4 - uVar5;
          uVar4 = uVar5;
          uVar5 = (ulong)((int)uVar5 + 1);
        } while (bVar3 && lVar2 != 0);
      }
      local_108.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_108.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_108.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (local_188.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_188.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar4 = 0;
        uVar5 = 1;
        do {
          pvVar1 = &local_188.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar4]._m_values;
          local_168._0_8_ = *(undefined8 *)((long)(pvVar1 + -1) + 8);
          local_168._m_betaI = *(BGPolicyIndex *)((long)(pvVar1 + -1) + 0x10);
          std::vector<double,_std::allocator<double>_>::vector(&local_168._m_values,pvVar1);
          local_b8._m_action = local_138._m_action;
          local_b8._4_4_ = local_138._4_4_;
          local_b8._m_betaI = local_138._m_betaI;
          std::vector<double,_std::allocator<double>_>::vector
                    (&local_b8._m_values,&local_138._m_values);
          local_e8._m_action = local_168._m_action;
          local_e8._4_4_ = local_168._4_4_;
          local_e8._m_betaI = local_168._m_betaI;
          std::vector<double,_std::allocator<double>_>::vector
                    (&local_e8._m_values,&local_168._m_values);
          bVar3 = ParetoDominates(&local_b8,&local_e8);
          AlphaVector::~AlphaVector(&local_e8);
          AlphaVector::~AlphaVector(&local_b8);
          if (!bVar3) {
            std::vector<AlphaVector,_std::allocator<AlphaVector>_>::push_back(&local_108,&local_168)
            ;
          }
          AlphaVector::~AlphaVector(&local_168);
          uVar4 = ((long)local_188.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_188.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
          bVar3 = uVar5 <= uVar4;
          lVar2 = uVar4 - uVar5;
          uVar4 = uVar5;
          uVar5 = (ulong)((int)uVar5 + 1);
        } while (bVar3 && lVar2 != 0);
      }
      std::vector<AlphaVector,_std::allocator<AlphaVector>_>::push_back(local_170,&local_138);
      std::vector<AlphaVector,_std::allocator<AlphaVector>_>::operator=(&local_188,&local_108);
      std::vector<AlphaVector,_std::allocator<AlphaVector>_>::~vector(&local_108);
      AlphaVector::~AlphaVector(&local_138);
    } while (local_188.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
             super__Vector_impl_data._M_finish !=
             local_188.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
             super__Vector_impl_data._M_start);
  }
  std::vector<AlphaVector,_std::allocator<AlphaVector>_>::~vector(&local_188);
  return local_170;
}

Assistant:

ValueFunctionPOMDPDiscrete AlphaVectorPruning::ParetoPrune(const ValueFunctionPOMDPDiscrete &Vin)
{
    ValueFunctionPOMDPDiscrete uset = Vin;
    ValueFunctionPOMDPDiscrete result;
    while(uset.size()>0)
    {
        AlphaVector u = uset.at(0);
        for(Index i=1; i<uset.size();++i)
        {
            AlphaVector v = uset.at(i);
            if(ParetoDominates(v, u))
                u=v;
        }
        ValueFunctionPOMDPDiscrete uset2=ValueFunctionPOMDPDiscrete();
        for(Index i=0; i<uset.size();++i)
        {
            AlphaVector v = uset.at(i);
            if(!ParetoDominates(u, v))
                uset2.push_back(v);
        }
        result.push_back(u);
        uset=uset2;
    }

    return(result);
}